

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pragmaVtabCursorClear(PragmaVtabCursor *pCsr)

{
  long lVar1;
  
  sqlite3_finalize(pCsr->pPragma);
  pCsr->pPragma = (sqlite3_stmt *)0x0;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    sqlite3_free(pCsr->azArg[lVar1]);
    pCsr->azArg[lVar1] = (char *)0x0;
  }
  return;
}

Assistant:

static void pragmaVtabCursorClear(PragmaVtabCursor *pCsr){
  int i;
  sqlite3_finalize(pCsr->pPragma);
  pCsr->pPragma = 0;
  for(i=0; i<ArraySize(pCsr->azArg); i++){
    sqlite3_free(pCsr->azArg[i]);
    pCsr->azArg[i] = 0;
  }
}